

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

Expression * __thiscall
soul::ResolutionPass::FunctionResolver::createAtCall(FunctionResolver *this,CallOrCast *call)

{
  pool_ptr<soul::AST::CommaSeparatedList> *this_00;
  Expression *e;
  Expression *source;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  CommaSeparatedList *pCVar4;
  pool_ref<soul::AST::Expression> *ppVar5;
  EndpointDeclaration *pEVar6;
  EndpointDetails *pEVar7;
  Expression *pEVar8;
  Expression *pEVar9;
  Constant *pCVar10;
  ArraySize AVar11;
  ArrayElementRef *pAVar12;
  pool_ptr<soul::AST::EndpointDeclaration> endpoint;
  pool_ptr<soul::AST::Expression> endpointArraySize;
  RefCountedPtr<soul::Structure> RStack_158;
  pool_ptr<soul::AST::Expression> local_150;
  CompileMessage local_148;
  CompileMessage local_110;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  sVar3 = AST::CallOrCastBase::getNumArguments(&call->super_CallOrCastBase);
  if (sVar3 != 2) {
    Errors::atMethodTakes1Arg<>();
    AST::Context::throwError
              (&(call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
                context,&local_68,false);
  }
  this_00 = &(call->super_CallOrCastBase).arguments;
  pCVar4 = pool_ptr<soul::AST::CommaSeparatedList>::operator->(this_00);
  ppVar5 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::operator[]
                     (&pCVar4->items,0);
  e = ppVar5->object;
  pCVar4 = pool_ptr<soul::AST::CommaSeparatedList>::operator->(this_00);
  ppVar5 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::operator[]
                     (&pCVar4->items,1);
  source = ppVar5->object;
  endpointArraySize.object = (Expression *)0x800000001;
  RStack_158.object = (Structure *)0x0;
  iVar2 = (*(source->super_Statement).super_ASTObject._vptr_ASTObject[0x10])(source);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&RStack_158);
  if ((char)iVar2 == '\0') {
    endpointArraySize.object = (Expression *)0x700000001;
    RStack_158.object = (Structure *)0x0;
    SanityCheckPass::expectSilentCastPossible
              (&(call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
                context,(Type *)&endpointArraySize,source);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&RStack_158);
  }
  if (e->kind != value) {
    if (e->kind != endpoint) {
      Errors::expectedValueOrEndpoint<>();
      AST::Context::throwError
                (&(call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
                  context,&local_a0,false);
    }
    bVar1 = AST::isResolvedAsOutput(e);
    if (!bVar1) {
      throwInternalCompilerError("AST::isResolvedAsOutput (array)","createAtCall",0xa39);
    }
    endpointArraySize.object = (Expression *)0x0;
    (*(e->super_Statement).super_ASTObject._vptr_ASTObject[8])(&endpoint,e);
    if (CONCAT71(endpoint.object._1_7_,endpoint.object._0_1_) != 0) {
      pEVar6 = pool_ptr<soul::AST::EndpointDeclaration>::operator->(&endpoint);
      if ((pEVar6->details).object == (EndpointDetails *)0x0) {
        Errors::cannotResolveSourceOfAtMethod<>();
        AST::Context::throwError(&(e->super_Statement).super_ASTObject.context,&local_d8,false);
      }
      pEVar6 = pool_ptr<soul::AST::EndpointDeclaration>::operator->(&endpoint);
      pEVar7 = pool_ptr<soul::AST::EndpointDetails>::operator*(&pEVar6->details);
      endpointArraySize.object = (pEVar7->arraySize).object;
      if (endpointArraySize.object != (Expression *)0x0) {
        local_150.object = endpointArraySize.object;
        bVar1 = AST::isResolvedAsConstant(&local_150);
        if (!bVar1) {
          throwInternalCompilerError
                    ("AST::isResolvedAsConstant (endpointArraySize)","createAtCall",0xa48);
        }
        pEVar8 = pool_ptr<soul::AST::Expression>::operator->(&endpointArraySize);
        pEVar9 = pool_ptr<soul::AST::Expression>::operator->(&endpointArraySize);
        (*(pEVar9->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&endpoint,pEVar9);
        pCVar10 = pool_ptr<soul::AST::Constant>::operator->
                            ((pool_ptr<soul::AST::Constant> *)&endpoint);
        AVar11 = TypeRules::checkAndGetArraySize<soul::AST::Context&>
                           (&(pEVar8->super_Statement).super_ASTObject.context,&pCVar10->value);
        if ((int)AVar11 != 0) goto LAB_0024a76d;
      }
    }
    Errors::wrongTypeForAtMethod<>();
    AST::Context::throwError
              (&(call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
                context,&local_110,false);
  }
  (*(e->super_Statement).super_ASTObject._vptr_ASTObject[4])(&endpointArraySize,e);
  if (((byte)endpointArraySize.object & 0xfe) != 2) {
    Errors::wrongTypeForAtMethod<>();
    AST::Context::throwError
              (&(call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
                context,&local_148,false);
  }
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&RStack_158);
LAB_0024a76d:
  endpointArraySize.object = (Expression *)0x0;
  endpoint.object._0_1_ = 0;
  pAVar12 = PoolAllocator::
            allocate<soul::AST::ArrayElementRef,soul::AST::Context&,soul::AST::Expression&,soul::AST::Expression&,decltype(nullptr),bool>
                      (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,
                       &(call->super_CallOrCastBase).super_Expression.super_Statement.
                        super_ASTObject.context,e,source,&endpointArraySize.object,(bool *)&endpoint
                      );
  pAVar12->suppressWrapWarning = true;
  return &pAVar12->super_Expression;
}

Assistant:

AST::Expression& createAtCall (AST::CallOrCast& call)
        {
            if (call.getNumArguments() != 2)
                call.context.throwError (Errors::atMethodTakes1Arg());

            auto& array = call.arguments->items[0].get();
            auto& index = call.arguments->items[1].get();

            if (! index.canSilentlyCastTo (PrimitiveType::int64))
                SanityCheckPass::expectSilentCastPossible (call.context, Type (PrimitiveType::int32), index);

            if (array.kind == AST::ExpressionKind::endpoint)
            {
                SOUL_ASSERT (AST::isResolvedAsOutput (array));
                pool_ptr<AST::Expression> endpointArraySize;

                if (auto endpoint = array.getAsEndpoint())
                {
                    if (endpoint->isUnresolvedChildReference())
                        array.context.throwError (Errors::cannotResolveSourceOfAtMethod());

                    endpointArraySize = endpoint->getDetails().arraySize;
                }

                Type::BoundedIntSize arraySize = 0;

                if (endpointArraySize != nullptr)
                {
                    SOUL_ASSERT (AST::isResolvedAsConstant (endpointArraySize));
                    arraySize = static_cast<Type::BoundedIntSize> (TypeRules::checkAndGetArraySize (endpointArraySize->context,
                                                                                                    endpointArraySize->getAsConstant()->value));
                }

                if (arraySize == 0)
                    call.context.throwError (Errors::wrongTypeForAtMethod());
            }
            else if (array.kind == AST::ExpressionKind::value)
            {
                auto arrayType = array.getResultType();

                if (! arrayType.isArrayOrVector())
                    call.context.throwError (Errors::wrongTypeForAtMethod());
            }
            else
            {
                call.context.throwError (Errors::expectedValueOrEndpoint());
            }

            auto& ref = allocator.allocate<AST::ArrayElementRef> (call.context, array, index, nullptr, false);
            ref.suppressWrapWarning = true;
            return ref;
        }